

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O0

ostream * operator<<(ostream *o,Person *p)

{
  ostream *poVar1;
  string *psVar2;
  Address *a;
  Person *p_local;
  ostream *o_local;
  
  poVar1 = std::operator<<(o,"name-> ");
  psVar2 = Person::getName_abi_cxx11_(p);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1,", id-> ");
  psVar2 = Person::getId_abi_cxx11_(p);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1,", address-> ");
  a = Person::getAddress(p);
  operator<<(poVar1,a);
  return o;
}

Assistant:

ostream& operator <<(ostream& o, const Person& p) {

    o << "name-> " << p.getName() << ", id-> " << p.getId() << ", address-> " << p.getAddress();
    return o;
}